

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

hwaddr ppc_hash32_get_phys_page_debug_ppc64(PowerPCCPU_conflict3 *cpu,target_ulong eaddr)

{
  ulong sr_00;
  hwaddr hVar1;
  hwaddr raddr;
  ppc_hash_pte32_t pStack_40;
  int prot;
  ppc_hash_pte32_t pte;
  hwaddr pte_offset;
  target_ulong sr;
  CPUPPCState_conflict2 *env;
  target_ulong eaddr_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  cpu_local = (PowerPCCPU_conflict3 *)eaddr;
  if ((((cpu->env).msr >> 4 & 1) != 0) &&
     (((cpu->env).nb_BATs == 0 ||
      (cpu_local = (PowerPCCPU_conflict3 *)
                   ppc_hash32_bat_lookup(cpu,eaddr,0,(int *)((long)&raddr + 4)),
      cpu_local == (PowerPCCPU_conflict3 *)0xffffffffffffffff)))) {
    sr_00 = (cpu->env).sr[eaddr >> 0x1c];
    if ((sr_00 & 0x80000000) == 0) {
      pte = (ppc_hash_pte32_t)ppc_hash32_htab_lookup(cpu,sr_00,eaddr,&stack0xffffffffffffffc0);
      if (pte == (ppc_hash_pte32_t)0xffffffffffffffff) {
        cpu_local = (PowerPCCPU_conflict3 *)0xffffffffffffffff;
      }
      else {
        hVar1 = ppc_hash32_pte_raddr(sr_00,pStack_40,eaddr);
        cpu_local = (PowerPCCPU_conflict3 *)(hVar1 & 0xfffffffffffff000);
      }
    }
    else {
      cpu_local = (PowerPCCPU_conflict3 *)0xffffffffffffffff;
    }
  }
  return (hwaddr)cpu_local;
}

Assistant:

hwaddr ppc_hash32_get_phys_page_debug(PowerPCCPU *cpu, target_ulong eaddr)
{
    CPUPPCState *env = &cpu->env;
    target_ulong sr;
    hwaddr pte_offset;
    ppc_hash_pte32_t pte;
    int prot;

    if (msr_dr == 0) {
        /* Translation is off */
        return eaddr;
    }

    if (env->nb_BATs != 0) {
        hwaddr raddr = ppc_hash32_bat_lookup(cpu, eaddr, 0, &prot);
        if (raddr != -1) {
            return raddr;
        }
    }

    sr = env->sr[eaddr >> 28];

    if (sr & SR32_T) {
        /* FIXME: Add suitable debug support for Direct Store segments */
        return -1;
    }

    pte_offset = ppc_hash32_htab_lookup(cpu, sr, eaddr, &pte);
    if (pte_offset == -1) {
        return -1;
    }

    return ppc_hash32_pte_raddr(sr, pte, eaddr) & TARGET_PAGE_MASK;
}